

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
          (Vector<glm::vec<3,float,(glm::qualifier)0>> *this,int *args,int *args_1,float *args_2)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::grow
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)this,*(long *)(this + 0x10) + 1);
  }
  lVar3 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  iVar2 = *args_1;
  fVar1 = *args_2;
  *(float *)(lVar3 + lVar4 * 0xc) = (float)*args;
  *(float *)(lVar3 + 4 + lVar4 * 0xc) = (float)iVar2;
  *(float *)(lVar3 + 8 + lVar4 * 0xc) = fVar1;
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void Vector<T>::emplace_back(Args&&... args)noexcept
{
    if(_size == _capacity)
        grow(_capacity+1);
    new ((void*)&_data[_size]) T(tl::forward<Args>(args)...);
    _size++;
}